

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack28_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0xfffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x1c;
  out[1] = (uVar1 >> 0x1c) + base + (in[1] & 0xffffff) * 0x10;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x18;
  out[2] = (uVar1 >> 0x18) + base + (in[2] & 0xfffff) * 0x100;
  uVar1 = in[2];
  out[3] = uVar1 >> 0x14;
  out[3] = (uVar1 >> 0x14) + base + (in[3] & 0xffff) * 0x1000;
  uVar1 = in[3];
  out[4] = uVar1 >> 0x10;
  out[4] = (uVar1 >> 0x10) + base + (in[4] & 0xfff) * 0x10000;
  uVar1 = in[4];
  out[5] = uVar1 >> 0xc;
  out[5] = (uVar1 >> 0xc) + base + (in[5] & 0xff) * 0x100000;
  uVar1 = in[5];
  out[6] = uVar1 >> 8;
  out[6] = (uVar1 >> 8) + base + (in[6] & 0xf) * 0x1000000;
  out[7] = (in[6] >> 4) + base;
  out[8] = (in[7] & 0xfffffff) + base;
  uVar1 = in[7];
  out[9] = uVar1 >> 0x1c;
  out[9] = (uVar1 >> 0x1c) + base + (in[8] & 0xffffff) * 0x10;
  uVar1 = in[8];
  out[10] = uVar1 >> 0x18;
  out[10] = (uVar1 >> 0x18) + base + (in[9] & 0xfffff) * 0x100;
  uVar1 = in[9];
  out[0xb] = uVar1 >> 0x14;
  out[0xb] = (uVar1 >> 0x14) + base + (in[10] & 0xffff) * 0x1000;
  uVar1 = in[10];
  out[0xc] = uVar1 >> 0x10;
  out[0xc] = (uVar1 >> 0x10) + base + (in[0xb] & 0xfff) * 0x10000;
  uVar1 = in[0xb];
  out[0xd] = uVar1 >> 0xc;
  out[0xd] = (uVar1 >> 0xc) + base + (in[0xc] & 0xff) * 0x100000;
  uVar1 = in[0xc];
  out[0xe] = uVar1 >> 8;
  out[0xe] = (uVar1 >> 8) + base + (in[0xd] & 0xf) * 0x1000000;
  out[0xf] = (in[0xd] >> 4) + base;
  out[0x10] = (in[0xe] & 0xfffffff) + base;
  uVar1 = in[0xe];
  out[0x11] = uVar1 >> 0x1c;
  out[0x11] = (uVar1 >> 0x1c) + base + (in[0xf] & 0xffffff) * 0x10;
  uVar1 = in[0xf];
  out[0x12] = uVar1 >> 0x18;
  out[0x12] = (uVar1 >> 0x18) + base + (in[0x10] & 0xfffff) * 0x100;
  uVar1 = in[0x10];
  out[0x13] = uVar1 >> 0x14;
  out[0x13] = (uVar1 >> 0x14) + base + (in[0x11] & 0xffff) * 0x1000;
  uVar1 = in[0x11];
  out[0x14] = uVar1 >> 0x10;
  out[0x14] = (uVar1 >> 0x10) + base + (in[0x12] & 0xfff) * 0x10000;
  uVar1 = in[0x12];
  out[0x15] = uVar1 >> 0xc;
  out[0x15] = (uVar1 >> 0xc) + base + (in[0x13] & 0xff) * 0x100000;
  uVar1 = in[0x13];
  out[0x16] = uVar1 >> 8;
  out[0x16] = (uVar1 >> 8) + base + (in[0x14] & 0xf) * 0x1000000;
  out[0x17] = (in[0x14] >> 4) + base;
  out[0x18] = (in[0x15] & 0xfffffff) + base;
  uVar1 = in[0x15];
  out[0x19] = uVar1 >> 0x1c;
  out[0x19] = (uVar1 >> 0x1c) + base + (in[0x16] & 0xffffff) * 0x10;
  uVar1 = in[0x16];
  out[0x1a] = uVar1 >> 0x18;
  out[0x1a] = (uVar1 >> 0x18) + base + (in[0x17] & 0xfffff) * 0x100;
  uVar1 = in[0x17];
  out[0x1b] = uVar1 >> 0x14;
  out[0x1b] = (uVar1 >> 0x14) + base + (in[0x18] & 0xffff) * 0x1000;
  uVar1 = in[0x18];
  out[0x1c] = uVar1 >> 0x10;
  out[0x1c] = (uVar1 >> 0x10) + base + (in[0x19] & 0xfff) * 0x10000;
  uVar1 = in[0x19];
  out[0x1d] = uVar1 >> 0xc;
  out[0x1d] = (uVar1 >> 0xc) + base + (in[0x1a] & 0xff) * 0x100000;
  uVar1 = in[0x1a];
  out[0x1e] = uVar1 >> 8;
  out[0x1e] = (uVar1 >> 8) + base + (in[0x1b] & 0xf) * 0x1000000;
  out[0x1f] = (in[0x1b] >> 4) + base;
  return in + 0x1c;
}

Assistant:

uint32_t * unpack28_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}